

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturmchain.h
# Opt level: O0

int __thiscall gmath::SturmChain<double>::countSignChangesPosInf(SturmChain<double> *this)

{
  Polynomial<double> *this_00;
  long lVar1;
  int iVar2;
  int *in_RDI;
  double dVar3;
  double f2;
  int k;
  int ret;
  double f1;
  int local_18;
  int local_14;
  double local_10;
  
  local_14 = 0;
  this_00 = *(Polynomial<double> **)(in_RDI + 2);
  iVar2 = Polynomial<double>::getDegree(*(Polynomial<double> **)(in_RDI + 2));
  local_10 = Polynomial<double>::operator[](this_00,iVar2);
  for (local_18 = 1; local_18 < *in_RDI; local_18 = local_18 + 1) {
    lVar1 = *(long *)(in_RDI + 2);
    iVar2 = Polynomial<double>::getDegree
                      ((Polynomial<double> *)(*(long *)(in_RDI + 2) + (long)local_18 * 0x10));
    dVar3 = Polynomial<double>::operator[]
                      ((Polynomial<double> *)(lVar1 + (long)local_18 * 0x10),iVar2);
    if (((local_10 < 0.0) && (0.0 <= dVar3)) || ((0.0 <= local_10 && (dVar3 < 0.0)))) {
      local_14 = local_14 + 1;
    }
    local_10 = dVar3;
  }
  return local_14;
}

Assistant:

int countSignChangesPosInf() const
    {
      double f1;
      int    ret=0;

      // the sign of the highest coefficient has the same sign as the
      // limes at positive infinity

      f1=f[0][f[0].getDegree()];

      for (int k=1; k<n; k++)
      {
        double f2=f[k][f[k].getDegree()];

        if ((f1 < 0 && f2 >= 0) || (f1 >= 0 && f2 < 0))
        {
          ret++;
        }

        f1=f2;
      }

      return ret;
    }